

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O1

int __thiscall MixerContext::auto_matrix(MixerContext *this)

{
  cubeb_sample_format cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  double (*padVar6) [32];
  uint32_t i;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  double *pdVar12;
  double (*padVar13) [32];
  float (*pafVar14) [32];
  uint uVar15;
  uint32_t i_2;
  double *pdVar16;
  undefined8 *puVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  uint32_t j;
  ulong uVar21;
  int iVar22;
  undefined8 *puVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  undefined8 auStack_a48 [2];
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a18 [2];
  double local_a08;
  double local_a00;
  double local_9a8;
  double local_9a0;
  double local_990;
  double local_980;
  double local_978;
  double local_968;
  undefined1 local_928 [16];
  double local_918;
  double local_910;
  undefined1 local_908 [16];
  double local_8f8;
  double local_8f0;
  double local_8e8;
  undefined1 local_8e0 [280];
  double local_7c8;
  double local_7c0;
  double local_738;
  double local_728;
  undefined1 local_5a8 [40];
  undefined1 local_580 [104];
  double local_518;
  double local_4f8;
  double local_480;
  double local_468;
  
  puVar23 = auStack_a48;
  puVar17 = auStack_a48;
  memset(auStack_a48,0,0xa20);
  uVar15 = this->_in_ch_layout;
  if ((((1 < uVar15) &&
       (uVar7 = uVar15 - (uVar15 >> 1 & 0x55555555),
       uVar7 = (uVar7 >> 2 & 0x33333333) + (uVar7 & 0x33333333),
       ((uVar7 >> 4) + uVar7 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) &&
      (uVar15 = 4, g_cubeb_log_callback != (cubeb_log_callback)0x0)) && (0 < (int)g_cubeb_log_level)
     ) {
    (*g_cubeb_log_callback)("%s:%d: Treating layout as mono\n","cubeb_mixer.cpp",0x7d);
  }
  uVar7 = this->_out_ch_layout;
  if (((1 < uVar7) &&
      (uVar8 = uVar7 - (uVar7 >> 1 & 0x55555555),
      uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333),
      ((uVar8 >> 4) + uVar8 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) &&
     ((uVar7 = 4, g_cubeb_log_callback != (cubeb_log_callback)0x0 && (0 < (int)g_cubeb_log_level))))
  {
    (*g_cubeb_log_callback)("%s:%d: Treating layout as mono\n","cubeb_mixer.cpp",0x7d);
  }
  bVar5 = sane_layout(uVar15);
  if (bVar5) {
    bVar5 = sane_layout(uVar7);
    if (bVar5) {
      lVar9 = 0;
      do {
        if ((1 << ((byte)lVar9 & 0x1f) & uVar15 & uVar7) != 0) {
          *puVar23 = 0x3ff0000000000000;
        }
        lVar9 = lVar9 + 1;
        puVar23 = puVar23 + 0x13;
      } while (lVar9 != 0x12);
      uVar8 = uVar15 & ~uVar7;
      if (((~uVar7 & 3) == 0) && ((uVar8 & 4) != 0)) {
        if ((uVar15 & 3) == 0) {
          dVar27 = 0.7071067811865476;
        }
        else {
          dVar27 = (double)this->_center_mix_level;
        }
        local_a38 = local_a38 + dVar27;
        local_9a8 = dVar27 + local_9a8;
      }
      if (((uVar7 & 4) != 0) && ((uVar8 & 3) != 0)) {
        auVar26._8_4_ = SUB84((double)local_928._8_8_ + 0.7071067811865476,0);
        auVar26._0_8_ = (double)local_928._0_8_ + 0.7071067811865476;
        auVar26._12_4_ = (int)((ulong)((double)local_928._8_8_ + 0.7071067811865476) >> 0x20);
        local_928 = auVar26;
        if ((uVar15 & 4) != 0) {
          local_918 = (double)this->_center_mix_level * 1.4142135623730951;
        }
      }
      if ((uVar8 >> 8 & 1) != 0) {
        if ((uVar7 & 0x10) == 0) {
          if ((uVar7 >> 9 & 1) == 0) {
            if ((uVar7 & 1) == 0) {
              if ((uVar7 & 4) != 0) {
                local_8e8 = (double)this->_surround_mix_level * 0.7071067811865476 + local_8e8;
              }
            }
            else {
              dVar27 = (double)this->_surround_mix_level * 0.7071067811865476;
              local_a08 = local_a08 + dVar27;
              local_978 = dVar27 + local_978;
            }
          }
          else {
            local_4f8 = local_4f8 + 0.7071067811865476;
            local_468 = local_468 + 0.7071067811865476;
          }
        }
        else {
          local_7c8 = local_7c8 + 0.7071067811865476;
          local_738 = local_738 + 0.7071067811865476;
        }
      }
      if ((uVar8 & 0x10) != 0) {
        if ((uVar7 >> 8 & 1) == 0) {
          if ((uVar7 >> 9 & 1) == 0) {
            if ((uVar7 & 1) == 0) {
              if ((uVar7 & 4) != 0) {
                dVar27 = (double)this->_surround_mix_level * 0.7071067811865476;
                dVar28 = dVar27 + (double)local_908._8_8_;
                local_908._8_4_ = SUB84(dVar28,0);
                local_908._0_8_ = dVar27 + (double)local_908._0_8_;
                local_908._12_4_ = (int)((ulong)dVar28 >> 0x20);
              }
            }
            else {
              local_a28 = local_a28 + (double)this->_surround_mix_level;
              local_990 = (double)this->_surround_mix_level + local_990;
            }
          }
          else {
            if ((uVar15 >> 9 & 1) == 0) {
              dVar27 = 1.0;
            }
            else {
              dVar27 = 0.7071067811865476;
            }
            local_518 = local_518 + dVar27;
            local_480 = dVar27 + local_480;
          }
        }
        else {
          auVar4._8_4_ = SUB84((double)local_5a8._8_8_ + 0.7071067811865476,0);
          auVar4._0_8_ = (double)local_5a8._0_8_ + 0.7071067811865476;
          auVar4._12_4_ = (int)((ulong)((double)local_5a8._8_8_ + 0.7071067811865476) >> 0x20);
          local_5a8._0_16_ = auVar4;
        }
      }
      if ((uVar8 >> 9 & 1) != 0) {
        if ((uVar7 & 0x10) == 0) {
          if ((uVar7 >> 8 & 1) == 0) {
            if ((uVar7 & 1) == 0) {
              if ((uVar7 & 4) != 0) {
                dVar27 = (double)this->_surround_mix_level * 0.7071067811865476;
                dVar28 = dVar27 + (double)local_8e0._8_8_;
                local_8e0._8_4_ = SUB84(dVar28,0);
                local_8e0._0_8_ = dVar27 + (double)local_8e0._0_8_;
                local_8e0._12_4_ = (int)((ulong)dVar28 >> 0x20);
              }
            }
            else {
              local_a00 = local_a00 + (double)this->_surround_mix_level;
              local_968 = (double)this->_surround_mix_level + local_968;
            }
          }
          else {
            auVar3._8_4_ = SUB84((double)local_580._8_8_ + 0.7071067811865476,0);
            auVar3._0_8_ = (double)local_580._0_8_ + 0.7071067811865476;
            auVar3._12_4_ = (int)((ulong)((double)local_580._8_8_ + 0.7071067811865476) >> 0x20);
            local_580._0_16_ = auVar3;
          }
        }
        else {
          if ((uVar15 & 0x10) == 0) {
            dVar27 = 1.0;
          }
          else {
            dVar27 = 0.7071067811865476;
          }
          local_7c0 = local_7c0 + dVar27;
          local_728 = dVar27 + local_728;
        }
      }
      if ((uVar7 & 5) != 0 && (uVar8 & 0x40) != 0) {
        bVar5 = (uVar7 & 1) == 0;
        dVar27 = *(double *)(&DAT_0013a6d0 + (ulong)bVar5 * 8);
        pdVar12 = local_a18;
        if (bVar5) {
          pdVar12 = &local_8f8;
        }
        pdVar16 = &local_980;
        if (bVar5) {
          pdVar16 = &local_8f0;
        }
        *pdVar12 = *pdVar12 + dVar27;
        *pdVar16 = dVar27 + *pdVar16;
      }
      if ((uVar8 & 8) != 0) {
        if ((uVar7 & 4) == 0) {
          if ((uVar7 & 1) != 0) {
            dVar27 = (double)this->_lfe_mix_level * 0.7071067811865476;
            local_a30 = local_a30 + dVar27;
            local_9a0 = dVar27 + local_9a0;
          }
        }
        else {
          local_910 = (double)this->_lfe_mix_level + local_910;
        }
      }
      padVar6 = this->_matrix;
      uVar24 = 0;
      uVar25 = 0;
      uVar10 = 0;
      uVar19 = 0;
      do {
        if ((uVar7 >> ((uint)uVar10 & 0x1f) & 1) != 0) {
          dVar27 = 0.0;
          uVar8 = 0x3ff00000;
          if ((uVar7 & uVar15 & 1 << ((byte)uVar10 & 0x1f)) == 0) {
            uVar8 = 0;
          }
          uVar21 = 0;
          iVar22 = 0;
          do {
            if ((uVar15 >> ((uint)uVar21 & 0x1f) & 1) != 0) {
              if (uVar21 < 0x12 && uVar10 < 0x12) {
                dVar28 = *(double *)((long)puVar17 + uVar21 * 8);
              }
              else {
                dVar28 = (double)((ulong)uVar8 << 0x20);
                if (uVar10 != uVar21) {
                  dVar28 = 0.0;
                }
              }
              padVar6[uVar19][iVar22] = dVar28;
              dVar27 = dVar27 + ABS(padVar6[uVar19][iVar22]);
              iVar22 = iVar22 + 1;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != 0x20);
          if (dVar27 <= (double)CONCAT44(uVar25,uVar24)) {
            dVar27 = (double)CONCAT44(uVar25,uVar24);
          }
          uVar19 = (ulong)((int)uVar19 + 1);
          uVar24 = SUB84(dVar27,0);
          uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
        }
        uVar10 = uVar10 + 1;
        puVar17 = (undefined8 *)((long)puVar17 + 0x90);
      } while (uVar10 != 0x20);
      cVar1 = this->_format;
      dVar27 = *(double *)(&DAT_0013a6f0 + (ulong)(cVar1 == CUBEB_SAMPLE_S16LE) * 8);
      if (dVar27 <= (double)CONCAT44(uVar25,uVar24) && (double)CONCAT44(uVar25,uVar24) != dVar27) {
        dVar27 = (double)CONCAT44(uVar25,uVar24) / dVar27;
        padVar13 = this->_matrix;
        lVar9 = 0;
        do {
          lVar20 = 0;
          do {
            auVar2._8_4_ = SUB84(dVar27,0);
            auVar2._0_8_ = dVar27;
            auVar2._12_4_ = (int)((ulong)dVar27 >> 0x20);
            auVar26 = divpd(*(undefined1 (*) [16])(*padVar13 + lVar20),auVar2);
            *(undefined1 (*) [16])(*padVar13 + lVar20) = auVar26;
            lVar20 = lVar20 + 2;
          } while (lVar20 != 0x20);
          lVar9 = lVar9 + 1;
          padVar13 = padVar13 + 1;
        } while (lVar9 != 0x20);
      }
      if (cVar1 == CUBEB_SAMPLE_FLOAT32LE) {
        pafVar14 = this->_matrix_flt;
        lVar9 = 0;
        do {
          lVar20 = 0;
          do {
            *(ulong *)(*pafVar14 + lVar20) =
                 CONCAT44((float)(*padVar6 + lVar20)[1],(float)(*padVar6)[lVar20]);
            lVar20 = lVar20 + 2;
          } while (lVar20 != 0x20);
          lVar9 = lVar9 + 1;
          padVar6 = padVar6 + 1;
          pafVar14 = pafVar14 + 1;
        } while (lVar9 != 0x20);
      }
      return 0;
    }
    if (g_cubeb_log_callback == (cubeb_log_callback)0x0) {
      return -1;
    }
    if ((int)g_cubeb_log_level < 1) {
      return -1;
    }
    uVar15 = this->_out_ch_layout;
    pcVar18 = "%s:%d: Output Layout %x is not supported\n";
    uVar11 = 0xc1;
  }
  else {
    if (g_cubeb_log_callback == (cubeb_log_callback)0x0) {
      return -1;
    }
    if ((int)g_cubeb_log_level < 1) {
      return -1;
    }
    uVar15 = this->_in_ch_layout;
    pcVar18 = "%s:%d: Input Layout %x is not supported\n";
    uVar11 = 0xbc;
  }
  (*g_cubeb_log_callback)(pcVar18,"cubeb_mixer.cpp",uVar11,(ulong)uVar15);
  return -1;
}

Assistant:

int MixerContext::auto_matrix()
{
  double matrix[NUM_NAMED_CHANNELS][NUM_NAMED_CHANNELS] = { { 0 } };
  double maxcoef = 0;
  float maxval;

  cubeb_channel_layout in_ch_layout = clean_layout(_in_ch_layout);
  cubeb_channel_layout out_ch_layout = clean_layout(_out_ch_layout);

  if (!sane_layout(in_ch_layout)) {
    // Channel Not Supported
    LOG("Input Layout %x is not supported", _in_ch_layout);
    return -1;
  }

  if (!sane_layout(out_ch_layout)) {
    LOG("Output Layout %x is not supported", _out_ch_layout);
    return -1;
  }

  for (uint32_t i = 0; i < FF_ARRAY_ELEMS(matrix); i++) {
    if (in_ch_layout & out_ch_layout & (1U << i)) {
      matrix[i][i] = 1.0;
    }
  }

  cubeb_channel_layout unaccounted = in_ch_layout & ~out_ch_layout;

  // Rematrixing is done via a matrix of coefficient that should be applied to
  // all channels. Channels are treated as pair and must be symmetrical (if a
  // left channel exists, the corresponding right should exist too) unless the
  // output layout has similar layout. Channels are then mixed toward the front
  // center or back center if they exist with a slight bias toward the front.

  if (unaccounted & CHANNEL_FRONT_CENTER) {
    if ((out_ch_layout & CUBEB_LAYOUT_STEREO) == CUBEB_LAYOUT_STEREO) {
      if (in_ch_layout & CUBEB_LAYOUT_STEREO) {
        matrix[FRONT_LEFT][FRONT_CENTER] += _center_mix_level;
        matrix[FRONT_RIGHT][FRONT_CENTER] += _center_mix_level;
      } else {
        matrix[FRONT_LEFT][FRONT_CENTER] += M_SQRT1_2;
        matrix[FRONT_RIGHT][FRONT_CENTER] += M_SQRT1_2;
      }
    }
  }
  if (unaccounted & CUBEB_LAYOUT_STEREO) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT] += M_SQRT1_2;
      if (in_ch_layout & CHANNEL_FRONT_CENTER)
        matrix[FRONT_CENTER][FRONT_CENTER] = _center_mix_level * M_SQRT2;
    }
  }

  if (unaccounted & CHANNEL_BACK_CENTER) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      matrix[BACK_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[BACK_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      matrix[SIDE_LEFT][BACK_CENTER] += M_SQRT1_2;
      matrix[SIDE_RIGHT][BACK_CENTER] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][BACK_CENTER] += _surround_mix_level * M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_CENTER] +=
        _surround_mix_level * M_SQRT1_2;
    }
  }
  if (unaccounted & CHANNEL_BACK_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][BACK_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][BACK_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_SIDE_LEFT) {
      if (in_ch_layout & CHANNEL_SIDE_LEFT) {
        matrix[SIDE_LEFT][BACK_LEFT] += M_SQRT1_2;
        matrix[SIDE_RIGHT][BACK_RIGHT] += M_SQRT1_2;
      } else {
        matrix[SIDE_LEFT][BACK_LEFT] += 1.0;
        matrix[SIDE_RIGHT][BACK_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][BACK_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][BACK_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][BACK_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][BACK_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_SIDE_LEFT) {
    if (out_ch_layout & CHANNEL_BACK_LEFT) {
      /* if back channels do not exist in the input, just copy side
         channels to back channels, otherwise mix side into back */
      if (in_ch_layout & CHANNEL_BACK_LEFT) {
        matrix[BACK_LEFT][SIDE_LEFT] += M_SQRT1_2;
        matrix[BACK_RIGHT][SIDE_RIGHT] += M_SQRT1_2;
      } else {
        matrix[BACK_LEFT][SIDE_LEFT] += 1.0;
        matrix[BACK_RIGHT][SIDE_RIGHT] += 1.0;
      }
    } else if (out_ch_layout & CHANNEL_BACK_CENTER) {
      matrix[BACK_CENTER][SIDE_LEFT] += M_SQRT1_2;
      matrix[BACK_CENTER][SIDE_RIGHT] += M_SQRT1_2;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][SIDE_LEFT] += _surround_mix_level;
      matrix[FRONT_RIGHT][SIDE_RIGHT] += _surround_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][SIDE_LEFT] += _surround_mix_level * M_SQRT1_2;
      matrix[FRONT_CENTER][SIDE_RIGHT] += _surround_mix_level * M_SQRT1_2;
    }
  }

  if (unaccounted & CHANNEL_FRONT_LEFT_OF_CENTER) {
    if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][FRONT_LEFT_OF_CENTER] += 1.0;
      matrix[FRONT_RIGHT][FRONT_RIGHT_OF_CENTER] += 1.0;
    } else if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][FRONT_LEFT_OF_CENTER] += M_SQRT1_2;
      matrix[FRONT_CENTER][FRONT_RIGHT_OF_CENTER] += M_SQRT1_2;
    }
  }
  /* mix LFE into front left/right or center */
  if (unaccounted & CHANNEL_LOW_FREQUENCY) {
    if (out_ch_layout & CHANNEL_FRONT_CENTER) {
      matrix[FRONT_CENTER][LOW_FREQUENCY] += _lfe_mix_level;
    } else if (out_ch_layout & CHANNEL_FRONT_LEFT) {
      matrix[FRONT_LEFT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
      matrix[FRONT_RIGHT][LOW_FREQUENCY] += _lfe_mix_level * M_SQRT1_2;
    }
  }

  // Normalize the conversion matrix.
  for (uint32_t out_i = 0, i = 0; i < CHANNELS_MAX; i++) {
    double sum = 0;
    int in_i = 0;
    if ((out_ch_layout & (1U << i)) == 0) {
      continue;
    }
    for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
      if ((in_ch_layout & (1U << j)) == 0) {
        continue;
      }
      if (i < FF_ARRAY_ELEMS(matrix) && j < FF_ARRAY_ELEMS(matrix[0])) {
        _matrix[out_i][in_i] = matrix[i][j];
      } else {
        _matrix[out_i][in_i] =
          i == j && (in_ch_layout & out_ch_layout & (1U << i));
      }
      sum += fabs(_matrix[out_i][in_i]);
      in_i++;
    }
    maxcoef = std::max(maxcoef, sum);
    out_i++;
  }

  if (_format == CUBEB_SAMPLE_S16NE) {
    maxval = 1.0;
  } else {
    maxval = INT_MAX;
  }

  // Normalize matrix if needed.
  if (maxcoef > maxval) {
    maxcoef /= maxval;
    for (uint32_t i = 0; i < CHANNELS_MAX; i++)
      for (uint32_t j = 0; j < CHANNELS_MAX; j++) {
        _matrix[i][j] /= maxcoef;
      }
  }

  if (_format == CUBEB_SAMPLE_FLOAT32NE) {
    for (uint32_t i = 0; i < FF_ARRAY_ELEMS(_matrix); i++) {
      for (uint32_t j = 0; j < FF_ARRAY_ELEMS(_matrix[0]); j++) {
        _matrix_flt[i][j] = _matrix[i][j];
      }
    }
  }

  return 0;
}